

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O3

void __thiscall ktx::CommandDeflate::executeDeflate(CommandDeflate *this)

{
  OptionsSingleInSingleOut *filepath;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  undefined8 stream;
  bool bVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  undefined1 extraout_DL;
  ktxSupercmpScheme extraout_EDX;
  size_type __rlen;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 testrun;
  ktxSupercmpScheme extraout_EDX_00;
  ktxSupercmpScheme scheme;
  char *pcVar10;
  Reporter *pRVar11;
  ulong uVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar13;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  KTXTexture2 texture;
  OutputStream outputFile;
  path outputPath;
  string newScParams;
  string writerScParams;
  smatch deflateOptionMatch;
  string origWriterName;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  InputStream inputStream;
  ktxTexture *local_528;
  path local_520;
  undefined1 local_4f8 [40];
  long lStack_4d0;
  string local_4c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  long lStack_498;
  char local_490;
  undefined7 uStack_48f;
  Reporter *local_480;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  char *local_430;
  size_type sStack_428;
  char local_420;
  undefined7 uStack_41f;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> local_410;
  undefined1 local_3e8 [952];
  
  filepath = &(this->options).super_OptionsSingleInSingleOut;
  pRVar11 = &(this->super_Command).super_Reporter;
  InputStream::InputStream((InputStream *)local_3e8,&filepath->inputFilepath,pRVar11);
  stream = local_3e8._32_8_;
  pcVar3 = (this->options).super_OptionsSingleInSingleOut.inputFilepath._M_dataplus._M_p;
  sVar4 = (this->options).super_OptionsSingleInSingleOut.inputFilepath._M_string_length;
  if ((sVar4 == 1) && (*pcVar3 == '-')) {
    local_4f8._0_8_ = local_4f8 + 0x10;
    local_4f8._16_6_ = 0x6e69647473;
    local_4f8._8_8_ = (pointer)0x5;
  }
  else {
    local_4f8._0_8_ = local_4f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,pcVar3,pcVar3 + sVar4);
  }
  validateToolInput((istream *)stream,(string *)local_4f8,pRVar11);
  pcVar5 = local_4f8 + 0x10;
  if ((pointer)local_4f8._0_8_ != pcVar5) {
    operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ + 1);
  }
  local_528 = (ktxTexture *)0x0;
  local_410._streambuf =
       *(basic_streambuf<char,_std::char_traits<char>_> **)
        (local_3e8._32_8_ + *(long *)(*(long *)local_3e8._32_8_ + -0x18) + 0xe8);
  local_410._vptr_StreambufStream = (_func_int **)&PTR__StreambufStream_0025c738;
  local_410._seek_mode = _S_in|_S_bin;
  local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
  super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
  super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<ktxStream,_std::default_delete<ktxStream>,_true,_true>)operator_new(0x68);
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x60) = 0;
  local_410._destructed = false;
  *(undefined4 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x38) = 3;
  *(StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> **)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x40) = &local_410;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
          _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x50) = 0;
  *(code **)local_410._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>
            ._M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
            super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::read;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 8) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::skip;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x10) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::write;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x18) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x20) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::setpos;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x28) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getsize;
  *(code **)((long)local_410._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl + 0x30) =
       StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::destruct;
  iVar8 = ktxTexture2_CreateFromStream
                    (local_410._stream._M_t.
                     super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                     super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                     super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&local_528);
  scheme = extraout_EDX;
  if (iVar8 != 0) {
    local_4f8._0_8_ = ktxErrorString(iVar8);
    Reporter::fatal<char_const(&)[34],char_const*>
              (pRVar11,INVALID_FILE,(char (*) [34])"Failed to create KTX2 texture: {}",
               (char **)local_4f8);
    scheme = extraout_EDX_00;
  }
  uVar2 = *(uint *)&local_528[1].vvtbl;
  if (uVar2 != 0) {
    if ((uVar2 & 0xfffffffe) == 2) {
      if ((this->options).super_Options.quiet != false) goto LAB_001815c7;
      toString_abi_cxx11_((string *)local_4f8,(ktx *)(ulong)uVar2,scheme);
      Reporter::warning<char_const(&)[46],std::__cxx11::string,std::__cxx11::string&>
                (pRVar11,(char (*) [46])"Modifying existing {} supercompression of {}.",
                 (string *)local_4f8,&filepath->inputFilepath);
    }
    else {
      toString_abi_cxx11_((string *)local_4f8,(ktx *)(ulong)uVar2,scheme);
      Reporter::fatal<char_const(&)[60],std::__cxx11::string>
                (pRVar11,INVALID_FILE,
                 (char (*) [60])"Cannot further deflate a KTX2 file supercompressed with {}.",
                 (string *)local_4f8);
    }
    if ((pointer)local_4f8._0_8_ != pcVar5) {
      operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ + 1);
    }
  }
LAB_001815c7:
  if ((this->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar8 = ktxTexture2_DeflateZstd
                      (local_528,
                       (this->options).super_OptionsDeflate.zstd.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (iVar8 != 0) {
      local_4f8._0_8_ = ktxErrorString(iVar8);
      Reporter::fatal<char_const(&)[37],char_const*>
                (pRVar11,IO_FAILURE,(char (*) [37])"Zstd deflation failed. KTX Error: {}",
                 (char **)local_4f8);
    }
  }
  if ((this->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar8 = ktxTexture2_DeflateZLIB
                      (local_528,
                       (this->options).super_OptionsDeflate.zlib.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (iVar8 != 0) {
      local_4f8._0_8_ = ktxErrorString(iVar8);
      Reporter::fatal<char_const(&)[37],char_const*>
                (pRVar11,IO_FAILURE,(char (*) [37])"ZLIB deflation failed. KTX Error: {}",
                 (char **)local_4f8);
    }
  }
  local_4a0._M_current = &local_490;
  lStack_498 = 0;
  local_490 = '\0';
  local_430 = &local_420;
  sStack_428 = 0;
  local_420 = '\0';
  local_4f8._8_8_ = (pointer)0x0;
  local_4f8._16_8_ = local_4f8._16_8_ & 0xffffffffffffff00;
  local_4f8._0_8_ = pcVar5;
  iVar8 = ktxHashList_FindValue(&local_528->kvDataHead,"KTXwriterScParams",&local_4c0,&local_520);
  if (iVar8 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)local_4f8,0,(char *)local_4f8._8_8_,
               (ulong)local_520._M_pathname._M_dataplus._M_p);
  }
  std::__cxx11::string::operator=((string *)&local_4a0,(string *)local_4f8);
  testrun = extraout_DL;
  if ((pointer)local_4f8._0_8_ != pcVar5) {
    operator_delete((void *)local_4f8._0_8_,(ulong)(local_4f8._16_8_ + 1));
    testrun = extraout_DL_00;
  }
  local_480 = pRVar11;
  if (lStack_498 != 0) {
    local_520._M_pathname._M_dataplus._M_p = (pointer)&local_520._M_pathname.field_2;
    local_520._M_pathname._M_string_length = 0;
    local_520._M_pathname.field_2._M_allocated_capacity =
         local_520._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar8 = ktxHashList_FindValue(&local_528->kvDataHead,"KTXwriter",&local_4c0,local_4f8);
    testrun = extraout_DL_01;
    if (iVar8 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_520,0,(char *)local_520._M_pathname._M_string_length,local_4f8._0_8_)
      ;
      testrun = extraout_DL_02;
    }
    if ((char *)local_520._M_pathname._M_string_length == (char *)0x0) {
      bVar6 = true;
    }
    else {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,
                 "ktx (?:create|deflate|encode|transcode)",0x10);
      local_478.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_478._M_begin._M_current = (char *)0x0;
      local_478.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_478.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4f8._16_8_ = (char *)0x0;
      local_4f8._24_8_ = 0;
      local_4f8._0_8_ = (pointer)0x0;
      local_4f8._8_8_ = (pointer)0x0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_520._M_pathname._M_dataplus._M_p,
                         (char *)(local_520._M_pathname._M_string_length +
                                 (long)local_520._M_pathname._M_dataplus._M_p),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_4f8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,0);
      if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ - local_4f8._0_8_);
      }
      if (bVar6) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,
                   " ?--(?:zlib|zstd) [1-9][0-9]?","",0x10);
        std::__detail::
        __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                  (local_4a0,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_4a0._M_current + lStack_498),&local_478,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,0);
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,"ktxsc|toktx",
                   "",0x10);
        local_4f8._16_8_ = (char *)0x0;
        local_4f8._24_8_ = 0;
        local_4f8._0_8_ = (pointer)0x0;
        local_4f8._8_8_ = (pointer)0x0;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_520._M_pathname._M_dataplus._M_p,
                           (char *)(local_520._M_pathname._M_string_length +
                                   (long)local_520._M_pathname._M_dataplus._M_p),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_4f8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,0);
        if ((pointer)local_4f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ - local_4f8._0_8_);
        }
        if (bVar6) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::_M_compile
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,
                     " ?--zcmp ?[1-9]?[0-9]?","",0x10);
          std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (local_4a0,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_4a0._M_current + lStack_498),&local_478,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0,0);
        }
        std::__cxx11::string::find((char)&local_520,0x20);
        std::__cxx11::string::substr((ulong)local_4f8,(ulong)&local_520);
        std::__cxx11::string::operator=((string *)&local_430,(string *)local_4f8);
        if ((pointer)local_4f8._0_8_ != pcVar5) {
          operator_delete((void *)local_4f8._0_8_,(ulong)(local_4f8._16_8_ + 1));
        }
      }
      if (local_478.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_478.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar9 = 0;
        uVar12 = 1;
        do {
          if (((long)local_478.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_478.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 3U <=
              uVar9) break;
          pcVar3 = local_478.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .first._M_current;
          pcVar10 = local_478.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9].
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .second._M_current + -(long)pcVar3;
          if (local_478.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9].matched == false) {
            pcVar10 = (char *)0x0;
          }
          std::__cxx11::string::replace
                    ((ulong)&local_4a0,(long)pcVar3 - (long)local_478._M_begin._M_current,pcVar10,
                     0x217ddc);
          uVar9 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (local_478.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_478.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      bVar6 = lStack_498 == 0;
      bVar13 = sStack_428 != 0;
      if (local_478.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_478.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_478.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_478.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar6 = bVar6 || bVar13;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_4c0);
      testrun = extraout_DL_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_pathname._M_dataplus._M_p != &local_520._M_pathname.field_2) {
      operator_delete(local_520._M_pathname._M_dataplus._M_p,
                      local_520._M_pathname.field_2._M_allocated_capacity + 1);
      testrun = extraout_DL_04;
    }
    if (!bVar6) {
      bVar6 = false;
      goto LAB_00181ab8;
    }
  }
  version_abi_cxx11_(&local_4c0,(ktx *)(ulong)(this->options).super_OptionsGeneric.testrun,
                     (bool)testrun);
  local_4f8._0_8_ = (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
  local_4f8._8_8_ = (this->super_Command).super_Reporter.commandName._M_string_length;
  local_4f8._16_8_ = local_4c0._M_dataplus._M_p;
  local_4f8._24_8_ = local_4c0._M_string_length;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x5;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_4f8;
  ::fmt::v10::vformat_abi_cxx11_(&local_520._M_pathname,(v10 *)0x206e90,fmt,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  ktxHashList_DeleteKVPair(&local_528->kvDataHead,"KTXwriter");
  ktxHashList_AddKVPair
            (&local_528->kvDataHead,"KTXwriter",(int)local_520._M_pathname._M_string_length + 1,
             local_520._M_pathname._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_pathname._M_dataplus._M_p != &local_520._M_pathname.field_2) {
    operator_delete(local_520._M_pathname._M_dataplus._M_p,
                    local_520._M_pathname.field_2._M_allocated_capacity + 1);
  }
  bVar6 = true;
LAB_00181ab8:
  local_4f8._0_8_ = (this->options).super_OptionsDeflate.compressOptions._M_dataplus._M_p;
  local_4f8._8_8_ = (this->options).super_OptionsDeflate.compressOptions._M_string_length;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x2;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_4f8;
  ::fmt::v10::vformat_abi_cxx11_(&local_4c0,(v10 *)0x20ab83,fmt_00,args_00);
  if (*local_4c0._M_dataplus._M_p == ' ') {
    if (lStack_498 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_4a0);
      pRVar11 = local_480;
      std::__cxx11::string::_M_erase((ulong)&local_4a0,0);
    }
    else if (bVar6) {
      std::__cxx11::string::_M_erase((ulong)&local_4c0,0);
      pRVar11 = local_480;
      local_4f8._0_8_ = local_4c0._M_dataplus._M_p;
      local_4f8._8_8_ = local_4c0._M_string_length;
      local_4f8._16_8_ = local_430;
      local_4f8._24_8_ = sStack_428;
      local_4f8._32_8_ = local_4a0._M_current;
      lStack_4d0 = lStack_498;
      fmt_01.size_ = 0xddd;
      fmt_01.data_ = (char *)0x11;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_4f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_520._M_pathname,(v10 *)"{} / (from {}) {}",fmt_01,args_01);
      std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_520);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_pathname._M_dataplus._M_p != &local_520._M_pathname.field_2) {
        operator_delete(local_520._M_pathname._M_dataplus._M_p,
                        local_520._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_4c0._M_dataplus._M_p);
      pRVar11 = local_480;
    }
    ktxHashList_DeleteKVPair(&local_528->kvDataHead,"KTXwriterScParams");
    ktxHashList_AddKVPair
              (&local_528->kvDataHead,"KTXwriterScParams",(int)lStack_498 + 1,local_4a0._M_current);
    pcVar5 = (this->options).super_OptionsSingleInSingleOut.outputFilepath._M_dataplus._M_p;
    local_450 = &local_440;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_450,pcVar5,
               pcVar5 + (this->options).super_OptionsSingleInSingleOut.outputFilepath.
                        _M_string_length);
    paVar1 = &local_520._M_pathname.field_2;
    if (local_450 == &local_440) {
      local_520._M_pathname.field_2._8_8_ = local_440._8_8_;
      local_520._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_520._M_pathname._M_dataplus._M_p = (pointer)local_450;
    }
    local_520._M_pathname.field_2._M_allocated_capacity._1_7_ =
         local_440._M_allocated_capacity._1_7_;
    local_520._M_pathname.field_2._M_local_buf[0] = local_440._M_local_buf[0];
    local_520._M_pathname._M_string_length = local_448;
    local_448 = 0;
    local_440._M_local_buf[0] = '\0';
    local_450 = &local_440;
    std::filesystem::__cxx11::path::path((path *)local_4f8,&local_520._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_520._M_pathname._M_dataplus._M_p,
                      local_520._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_450 != &local_440) {
      operator_delete(local_450,
                      CONCAT71(local_440._M_allocated_capacity._1_7_,local_440._M_local_buf[0]) + 1)
      ;
    }
    cVar7 = std::filesystem::__cxx11::path::has_parent_path();
    if (cVar7 != '\0') {
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::create_directories(&local_520);
      std::filesystem::__cxx11::path::~path(&local_520);
    }
    OutputStream::OutputStream
              ((OutputStream *)&local_520,
               &(this->options).super_OptionsSingleInSingleOut.outputFilepath,pRVar11);
    OutputStream::writeKTX2((OutputStream *)&local_520,local_528,pRVar11);
    OutputStream::~OutputStream((OutputStream *)&local_520);
    std::filesystem::__cxx11::path::~path((path *)local_4f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,CONCAT71(uStack_41f,local_420) + 1);
    }
    if (local_4a0._M_current != &local_490) {
      operator_delete(local_4a0._M_current,CONCAT71(uStack_48f,local_490) + 1);
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              (&local_410);
    if (local_528 != (ktxTexture *)0x0) {
      (*local_528->vtbl->Destroy)(local_528);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_3e8 + 0x230));
    std::ios_base::~ios_base((ios_base *)(local_3e8 + 0x2b0));
    std::ifstream::~ifstream(local_3e8 + 0x28);
    if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    return;
  }
  __assert_fail("newScParams[0] == \' \'",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_deflate.cpp"
                ,0x123,"void ktx::CommandDeflate::executeDeflate()");
}

Assistant:

void CommandDeflate::executeDeflate() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (texture->supercompressionScheme != KTX_SS_NONE) {
        switch (texture->supercompressionScheme) {
          case KTX_SS_ZLIB:
          case KTX_SS_ZSTD:
            if (!options.quiet) {
                warning("Modifying existing {} supercompression of {}.",
                        toString(texture->supercompressionScheme),
                        options.inputFilepath);
            }
            break;
          default:
            fatal(rc::INVALID_FILE,
                  "Cannot further deflate a KTX2 file supercompressed with {}.",
                  toString(texture->supercompressionScheme));
        }
    }

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    const auto& findMetadataValue = [&](const char* const key) {
        const char* value;
        uint32_t valueLen;
        std::string result;
        auto ret = ktxHashList_FindValue(&texture->kvDataHead, key,
                      &valueLen, (void**)&value);
        if (ret == KTX_SUCCESS) {
            // The values we are looking for are required to be NUL terminated.
            result.assign(value, valueLen - 1);
        }
        return result;
    };

    const auto updateMetadataValue = [&](const char* const key,
                                 const std::string& value) {
        ktxHashList_DeleteKVPair(&texture->kvDataHead, key);
        ktxHashList_AddKVPair(&texture->kvDataHead, key,
                static_cast<uint32_t>(value.size() + 1), // +1 to include \0
                value.c_str());
    };

    // ======= KTXwriter and KTXwriterScParams metadata handling =======
    //
    // In order to preserve encoding parameters applied to the data with
    // other apps prior to this deflate operation, `deflate` does the
    // following if KTXwriterScParams data exists in the input file:
    //
    // 1. If the writer was one of the ktx suite (i.e. create or encode)
    //    and KTXwriterScParams contains non-deflate options, use the
    //    original KTXwriter. Replace an existing deflate option with
    //    that currently specified or append it as new.
    //
    //    The original writer will obviously understand its own
    //    non-deflate options and, since it is part of the ktx suite
    //    it will understand the updated or new deflate option that will
    //    be added.
    //
    //    Cheeky! Spec. for KTXwriter says "only the most recent writer
    //    Should be identified." For KTXwriterScParams it says the writer
    //    should "append the (new) options" when "building on operations
    //    done previously." To somewhat resolve the conflict it changes
    //    the previous "only" to "in general."
    //
    // 2. If the writer was another tool, preserve its options in
    //    KTWwriterScParams labelled with its name and append the
    //    currently specified deflate option like so
    //
    //        --zstd 18 | (from <name>) option1 option2 ...
    //
    //    where <name> is the first word of the original KTXwriter metadata,
    //    e.g, "tokt". Rewrite KTXwriter with the name of this tool.
    //
    // 3. If the writer was ktxsc or toktx remove any original deflate
    //    option from the preserved parameters as we know those option
    //    names.

    bool changeWriter = true;
    std::string writerScParams;
    std::string origWriterName;
    writerScParams = findMetadataValue(KTX_WRITER_SCPARAMS_KEY);
    if (!writerScParams.empty()) {
        std::string writer = findMetadataValue(KTX_WRITER_KEY);
        if (!writer.empty()) {
            std::regex e("ktx (?:create|deflate|encode|transcode)");
            std::smatch deflateOptionMatch;
            if (std::regex_search(writer, e)) {
                // Writer is member of the ktx suite.
                // Look for existing deflate option
                e = " ?--(?:zlib|zstd) [1-9][0-9]?";
                (void)std::regex_search(writerScParams, deflateOptionMatch, e);
            } else {
                // Writer is not a member of the ktx suite
                e = "ktxsc|toktx";
                if (std::regex_search(writer, e)) {
                    // Look for toktx/ktxsc deflate option
                    e = " ?--zcmp ?[1-9]?[0-9]?";
                    (void)std::regex_search(writerScParams,
                                            deflateOptionMatch, e);
                }
                origWriterName = writer.substr(0, writer.find_first_of(' '));
            }
            // Remove existing deflate option since its value will not apply
            // to the newly deflated data.
            for (uint32_t i = 0; i < deflateOptionMatch.size(); i++) {
                 writerScParams.replace(deflateOptionMatch.position(i),
                                        deflateOptionMatch.length(i),
                                        "");
            }
            // Does ScParams still have data and is the original writer a
            // member of the ktx suite?
            if (!writerScParams.empty() && origWriterName.empty()) {
                changeWriter = false;
            }
        }
    }

    if (changeWriter) {
        // Create or modify KTXwriter metadata.
        const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
        updateMetadataValue(KTX_WRITER_KEY, writer);
    }

    // Format new writerScParams.
    auto newScParams = fmt::format("{}", options.compressOptions);
    // Options always contain a leading space
    assert(newScParams[0] == ' ');
    if (!writerScParams.empty()) {
        if (changeWriter) {
            // Leading space unneeded as this param will be first.
            newScParams.erase(newScParams.begin());
            writerScParams = fmt::format("{} / (from {}) {}", newScParams,
                                         origWriterName, writerScParams);
        } else {
            writerScParams.append(newScParams);
        }
    } else {
        writerScParams = newScParams;
        writerScParams.erase(writerScParams.begin()); // Erase leading space.
    }

    // Add KTXwriterScParams metadata
    updateMetadataValue(KTX_WRITER_SCPARAMS_KEY, writerScParams);

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}